

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtScalar.h
# Opt level: O1

cbtScalar anon_unknown.dwarf_67a99bc::p1_norm(cbtMatrix3x3 *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar1 = vandps_avx(ZEXT416((uint)a->m_el[0].m_floats[0]),auVar7);
  auVar2 = vandps_avx(ZEXT416((uint)a->m_el[1].m_floats[0]),auVar7);
  auVar3 = vandps_avx(ZEXT416((uint)a->m_el[2].m_floats[0]),auVar7);
  auVar4 = vandps_avx(ZEXT416((uint)a->m_el[0].m_floats[1]),auVar7);
  auVar5 = vandps_avx(ZEXT416((uint)a->m_el[1].m_floats[1]),auVar7);
  auVar6 = vandps_avx(ZEXT416((uint)a->m_el[2].m_floats[1]),auVar7);
  auVar4 = vmaxss_avx(ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_ + auVar3._0_4_)),
                      ZEXT416((uint)(auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_)));
  auVar1 = vandps_avx(ZEXT416((uint)a->m_el[0].m_floats[2]),auVar7);
  auVar2 = vandps_avx(ZEXT416((uint)a->m_el[1].m_floats[2]),auVar7);
  auVar3 = vandps_avx(ZEXT416((uint)a->m_el[2].m_floats[2]),auVar7);
  auVar1 = vmaxss_avx(auVar4,ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_ + auVar3._0_4_)));
  return auVar1._0_4_;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar cbtFabs(cbtScalar x) { return fabsf(x); }